

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

Time __thiscall helics::FederateState::nextMessageTime(FederateState *this)

{
  pointer puVar1;
  Time TVar2;
  Time TVar3;
  long lVar4;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *endpoint;
  pointer puVar5;
  shared_handle local_38;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock_shared(&local_38,&(this->interfaceInformation).endpoints);
  puVar1 = ((local_38.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0x7fffffffffffffff;
  for (puVar5 = ((local_38.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    TVar2 = EndpointInfo::firstMessageTime
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
    if (TVar3.internalTimeCode < TVar2.internalTimeCode) {
      TVar3 = TVar2;
    }
    if (TVar3.internalTimeCode < lVar4) {
      lVar4 = TVar3.internalTimeCode;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_38.m_handle_lock);
  return (Time)lVar4;
}

Assistant:

Time FederateState::nextMessageTime() const
{
    auto firstMessageTime = Time::maxVal();
    for (const auto& endpoint : interfaceInformation.getEndpoints()) {
        auto messageTime = endpoint->firstMessageTime();
        if (messageTime < time_granted) {
            messageTime = time_granted;
        }
        if (messageTime < firstMessageTime) {
            firstMessageTime = messageTime;
        }
    }
    return firstMessageTime;
}